

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall Network::Network(Network *this,Network_param *param)

{
  Clock *pCVar1;
  Logging *pLVar2;
  
  (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->param = param;
  (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = Clock::getInstance();
  this->clock = pCVar1;
  pLVar2 = Logging::getInstance();
  this->logger = pLVar2;
  return;
}

Assistant:

Network::Network(Network_param* param) : 
    param(param) 
{
    clock = Clock::getInstance();
    logger = Logging::getInstance();
}